

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O2

FString __thiscall OPLMIDIDevice::GetStats(OPLMIDIDevice *this)

{
  ulong uVar1;
  long in_RSI;
  char star [3];
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x71deec;
  for (uVar1 = 0; uVar1 < *(uint *)(*(long *)(in_RSI + 0x170) + 0x48); uVar1 = uVar1 + 1) {
    FString::AppendCStrPart((FString *)this,star,3);
  }
  return (FString)(char *)this;
}

Assistant:

FString OPLMIDIDevice::GetStats()
{
	FString out;
	char star[3] = { TEXTCOLOR_ESCAPE, 'A', '*' };
	for (uint i = 0; i < io->OPLchannels; ++i)
	{
		if (channels[i].flags & CH_FREE)
		{
			star[1] = CR_BRICK + 'A';
		}
		else if (channels[i].flags & CH_SUSTAIN)
		{
			star[1] = CR_ORANGE + 'A';
		}
		else if (channels[i].flags & CH_SECONDARY)
		{
			star[1] = CR_BLUE + 'A';
		}
		else
		{
			star[1] = CR_GREEN + 'A';
		}
		out.AppendCStrPart (star, 3);
	}
	return out;
}